

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O0

int mcpl2phits_parse_args
              (int argc,char **argv,char **inmcplfile,char **outphitsfile,uint64_t *nparticles_limit
              ,int *use64bitreclen,int *nopolarisation)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  int in_EDI;
  long *in_R8;
  undefined4 *in_R9;
  size_t j;
  int64_t *consume_digit;
  size_t n;
  char *a;
  int i;
  int64_t opt_num_limit;
  char *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  int local_3c;
  char *local_38;
  undefined4 *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  *in_RDX = 0;
  *in_RCX = 0;
  *in_R8 = -1;
  *in_R9 = 0;
  *(undefined4 *)j = 0;
  local_38 = (char *)0xffffffffffffffff;
  local_3c = 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    if (local_8 <= local_3c) {
      if (*local_18 == 0) {
        local_4 = mcpl2phits_app_usage(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      }
      else {
        if (*local_20 == 0) {
          *local_20 = (long)"phits.dmp";
        }
        if ((long)local_38 < 1) {
          local_38 = (char *)0x0;
        }
        *local_28 = (long)local_38;
        local_4 = 0;
      }
      return local_4;
    }
    __s = *(char **)(local_10 + (long)local_3c * 8);
    pcVar2 = (char *)strlen(__s);
    if (pcVar2 != (char *)0x0) {
      if (((pcVar2 < (char *)0x2) || (*__s != '-')) || (__s[1] == '-')) {
        if ((pcVar2 == (char *)0x6) && (iVar1 = strcmp(__s,"--help"), iVar1 == 0)) {
          mcpl2phits_app_usage(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          return -1;
        }
        if ((pcVar2 == (char *)0x0) || (*__s == '-')) {
          iVar1 = mcpl2phits_app_usage(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          return iVar1;
        }
        if (*local_20 != 0) {
          iVar1 = mcpl2phits_app_usage(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          return iVar1;
        }
        if (*local_18 == 0) {
          *local_18 = (long)__s;
        }
        else {
          *local_20 = (long)__s;
        }
      }
      else {
        in_stack_ffffffffffffffa8 = (char **)0x0;
        for (in_stack_ffffffffffffffa0 = (char *)0x1; in_stack_ffffffffffffffa0 < pcVar2;
            in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
          if (in_stack_ffffffffffffffa8 == (char **)0x0) {
            switch(__s[(long)in_stack_ffffffffffffffa0]) {
            case 'f':
              *local_30 = 1;
              break;
            default:
              iVar1 = mcpl2phits_app_usage((char **)0x0,in_stack_ffffffffffffffa0);
              return iVar1;
            case 'h':
              mcpl2phits_app_usage((char **)0x0,in_stack_ffffffffffffffa0);
              return -1;
            case 'l':
              in_stack_ffffffffffffffa8 = &local_38;
              break;
            case 'n':
              *(undefined4 *)j = 1;
            }
            if ((in_stack_ffffffffffffffa8 != (char **)0x0) &&
               (*in_stack_ffffffffffffffa8 = (char *)0x0, in_stack_ffffffffffffffa0 + 1 == pcVar2))
            {
              iVar1 = mcpl2phits_app_usage(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
              return iVar1;
            }
          }
          else {
            if ((__s[(long)in_stack_ffffffffffffffa0] < '0') ||
               ('9' < __s[(long)in_stack_ffffffffffffffa0])) {
              iVar1 = mcpl2phits_app_usage(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
              return iVar1;
            }
            *in_stack_ffffffffffffffa8 = (char *)((long)*in_stack_ffffffffffffffa8 * 10);
            *in_stack_ffffffffffffffa8 =
                 *in_stack_ffffffffffffffa8 + (__s[(long)in_stack_ffffffffffffffa0] + -0x30);
          }
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int mcpl2phits_parse_args( int argc,const char **argv, const char** inmcplfile,
                           const char **outphitsfile, uint64_t* nparticles_limit,
                           int* use64bitreclen, int* nopolarisation ) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *outphitsfile = 0;
  *nparticles_limit = UINT64_MAX;
  *use64bitreclen = 0;
  *nopolarisation = 0;

  int64_t opt_num_limit = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2phits_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2phits_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 'f': *use64bitreclen = 1; break;
        case 'n': *nopolarisation = 1; break;
        default:
          return mcpl2phits_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2phits_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2phits_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outphitsfile)
        return mcpl2phits_app_usage(argv,"Too many arguments.");
      else if (*inmcplfile) *outphitsfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2phits_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2phits_app_usage(argv,"Missing argument : input MCPL file");
  if (!*outphitsfile)
    *outphitsfile = "phits.dmp";

  if (opt_num_limit<=0)
    opt_num_limit = 0;

  //NB: For now we allow unlimited number of particles in the file - but let the
  //mcpl2phits method emit a WARNING if exceeding INT32_MAX particles.
  *nparticles_limit = opt_num_limit;

  return 0;
}